

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O1

void __thiscall chrono::fea::ChElementHexaCorot_8::~ChElementHexaCorot_8(ChElementHexaCorot_8 *this)

{
  ~ChElementHexaCorot_8(this,&VTT);
  operator_delete(this,0x108);
  return;
}

Assistant:

ChElementHexaCorot_8::~ChElementHexaCorot_8() {
    delete ir;
    for (auto gpoint : GpVector)
        delete gpoint;
    GpVector.clear();
}